

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O0

bool __thiscall
BinaryModelSerialiserPrivate::writeBinary(BinaryModelSerialiserPrivate *this,QDataStream *writer)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int *piVar5;
  QDataStream *pQVar6;
  undefined1 local_138 [8];
  QVariant roleData_1;
  const_iterator local_110;
  const_iterator singleRole_1;
  int local_f0;
  int i_1;
  QVariant roleData;
  const_iterator local_c0;
  const_iterator singleRole;
  int local_9c;
  int i;
  QArrayDataPointer<char16_t> local_70;
  QString local_58;
  int local_3c;
  QDataStream *pQStack_38;
  qint32 writerVersion;
  QDataStream *writer_local;
  BinaryModelSerialiserPrivate *this_local;
  char16_t *local_20;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  if ((this->super_AbstractModelSerialiserPrivate).m_constModel == (QAbstractItemModel *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pQStack_38 = writer;
    writer_local = (QDataStream *)this;
    local_3c = QDataStream::version(writer);
    QDataStream::setVersion(pQStack_38,0xd);
    QDataStream::operator<<(pQStack_38,local_3c);
    QDataStream::setVersion(pQStack_38,local_3c);
    pQVar6 = pQStack_38;
    str = L"808FC674-78A0-4682-9C17-E05B18A0CDD3";
    local_20 = L"808FC674-78A0-4682-9C17-E05B18A0CDD3";
    local_10 = &local_70;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_70,(Data *)0x0,L"808FC674-78A0-4682-9C17-E05B18A0CDD3",0x24);
    QString::QString(&local_58,&local_70);
    ::operator<<(pQVar6,(QString *)&local_58);
    QString::~QString(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    pQVar6 = pQStack_38;
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff68);
    writeBinaryElement(this,pQVar6,(QModelIndex *)&stack0xffffffffffffff68);
    local_9c = 0;
    while( true ) {
      pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
      QModelIndex::QModelIndex((QModelIndex *)&singleRole);
      iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&singleRole);
      if (iVar4 <= local_9c) break;
      local_c0 = QList<int>::constBegin(&(this->super_AbstractModelSerialiserPrivate).m_rolesToSave)
      ;
      while( true ) {
        roleData.d._24_8_ =
             QList<int>::constEnd(&(this->super_AbstractModelSerialiserPrivate).m_rolesToSave);
        bVar2 = QList<int>::const_iterator::operator!=(&local_c0,(const_iterator)roleData.d._24_8_);
        if (!bVar2) break;
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
        piVar5 = QList<int>::const_iterator::operator*(&local_c0);
        (**(code **)(*(long *)pQVar1 + 0xa0))(&i_1,pQVar1,local_9c,1,*piVar5);
        bVar3 = ::QVariant::isNull();
        pQVar6 = pQStack_38;
        if ((bVar3 & 1) == 0) {
          piVar5 = QList<int>::const_iterator::operator*(&local_c0);
          pQVar6 = (QDataStream *)QDataStream::operator<<(pQVar6,*piVar5);
          ::operator<<(pQVar6,(QVariant *)&i_1);
        }
        ::QVariant::~QVariant((QVariant *)&i_1);
        QList<int>::const_iterator::operator++(&local_c0);
      }
      QDataStream::operator<<(pQStack_38,-1);
      local_9c = local_9c + 1;
    }
    local_f0 = 0;
    while( true ) {
      pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
      QModelIndex::QModelIndex((QModelIndex *)&singleRole_1);
      iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&singleRole_1);
      if (iVar4 <= local_f0) break;
      local_110 = QList<int>::constBegin
                            (&(this->super_AbstractModelSerialiserPrivate).m_rolesToSave);
      while( true ) {
        roleData_1.d._24_8_ =
             QList<int>::constEnd(&(this->super_AbstractModelSerialiserPrivate).m_rolesToSave);
        bVar2 = QList<int>::const_iterator::operator!=
                          (&local_110,(const_iterator)roleData_1.d._24_8_);
        if (!bVar2) break;
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
        piVar5 = QList<int>::const_iterator::operator*(&local_110);
        (**(code **)(*(long *)pQVar1 + 0xa0))(local_138,pQVar1,local_f0,2,*piVar5);
        bVar3 = ::QVariant::isNull();
        pQVar6 = pQStack_38;
        if ((bVar3 & 1) == 0) {
          piVar5 = QList<int>::const_iterator::operator*(&local_110);
          pQVar6 = (QDataStream *)QDataStream::operator<<(pQVar6,*piVar5);
          ::operator<<(pQVar6,(QVariant *)local_138);
        }
        ::QVariant::~QVariant((QVariant *)local_138);
        QList<int>::const_iterator::operator++(&local_110);
      }
      QDataStream::operator<<(pQStack_38,-1);
      local_f0 = local_f0 + 1;
    }
    iVar4 = QDataStream::status();
    this_local._7_1_ = iVar4 == 0;
  }
  return this_local._7_1_;
}

Assistant:

bool BinaryModelSerialiserPrivate::writeBinary(QDataStream &writer) const
{
    if (!m_constModel)
        return false;
    const qint32 writerVersion = writer.version();
    writer.setVersion(QDataStream::Qt_5_0);
    writer << writerVersion;
    writer.setVersion(writerVersion);
    writer << Magic_Model_Header;
    writeBinaryElement(writer);
    for (int i = 0; i < m_constModel->columnCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Horizontal, *singleRole);
            if (roleData.isNull())
                continue;
            writer << static_cast<qint32>(*singleRole) << roleData;
        }
        writer << static_cast<qint32>(-1);
    }
    for (int i = 0; i < m_constModel->rowCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Vertical, *singleRole);
            if (roleData.isNull())
                continue;
            writer << static_cast<qint32>(*singleRole) << roleData;
        }
        writer << static_cast<qint32>(-1);
    }
    return writer.status() == QDataStream::Ok;
}